

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Type TVar1;
  undefined8 *puVar2;
  HandlerSym *handlerSym;
  IRBuiltinFunction *callee;
  int extraout_EAX;
  Instr *pIVar3;
  undefined4 in_register_00000034;
  long lVar4;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *arg;
  undefined8 *puVar5;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> args;
  Value *v;
  allocator<char> local_69;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_68;
  string local_50;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar2 = *(undefined8 **)(lVar4 + 0x70);
  for (puVar5 = *(undefined8 **)(lVar4 + 0x68); puVar5 != puVar2; puVar5 = puVar5 + 1) {
    (**(code **)(*(long *)*puVar5 + 0x10))((long *)*puVar5,this);
    local_50._M_dataplus._M_p = (pointer)this->result_;
    if ((Value *)local_50._M_dataplus._M_p == (Value *)0x0) goto LAB_00120976;
    std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::push_back
              ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_68,
               (value_type *)&local_50);
  }
  handlerSym = *(HandlerSym **)(lVar4 + 0x40);
  TVar1 = (handlerSym->super_CallableSym).super_Symbol.type_;
  if (TVar1 == BuiltinFunction) {
    (*(handlerSym->super_CallableSym).super_Symbol.super_ASTNode._vptr_ASTNode[2])(handlerSym,this);
    callee = (IRBuiltinFunction *)this->result_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_69);
    pIVar3 = IRBuilder::createCallFunction
                       (&this->super_IRBuilder,callee,
                        (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_68,&local_50
                       );
    this->result_ = &pIVar3->super_Value;
    std::__cxx11::string::~string((string *)&local_50);
  }
  else if (TVar1 - BuiltinFunction < 2) {
    (*(handlerSym->super_CallableSym).super_Symbol.super_ASTNode._vptr_ASTNode[2])(handlerSym,this);
    pIVar3 = IRBuilder::createInvokeHandler
                       (&this->super_IRBuilder,(IRBuiltinHandler *)this->result_,
                        (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_68);
    this->result_ = &pIVar3->super_Value;
  }
  else {
    codegenInline(this,handlerSym);
    this->result_ = (Value *)0x0;
  }
LAB_00120976:
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_68);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(CallExpr& call) {
  std::vector<Value*> args;
  for (const std::unique_ptr<Expr>& arg : call.args().values()) {
    if (Value* v = codegen(arg.get())) {
      args.push_back(v);
    } else {
      return;
    }
  }

  if (call.callee()->isFunction()) {
    Value* callee = codegen(call.callee());
    // builtin function
    result_ = createCallFunction(static_cast<IRBuiltinFunction*>(callee), args);
  } else if (call.callee()->isBuiltin()) {
    Value* callee = codegen(call.callee());
    // builtin handler
    result_ = createInvokeHandler(static_cast<IRBuiltinHandler*>(callee), args);
  } else {
    // source handler
    codegenInline(*static_cast<HandlerSym*>(call.callee()));
    result_ = nullptr;
  }
}